

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

lzma_ret get_options(lzma_mt *options,lzma_options_easy *opt_easy,lzma_filter **filters,
                    uint64_t *block_size,uint64_t *outbuf_size_max)

{
  ulong uVar1;
  _Bool _Var2;
  uint64_t uVar3;
  lzma_ret lVar4;
  lzma_options_easy *filters_00;
  
  if (options == (lzma_mt *)0x0) {
    lVar4 = LZMA_PROG_ERROR;
  }
  else {
    lVar4 = LZMA_OPTIONS_ERROR;
    if ((options->flags == 0) && (0xffffbfff < options->threads - 0x4001)) {
      filters_00 = (lzma_options_easy *)options->filters;
      if (((lzma_options_easy *)options->filters == (lzma_options_easy *)0x0) &&
         (_Var2 = lzma_easy_preset(opt_easy,options->preset), filters_00 = opt_easy, _Var2)) {
        return LZMA_OPTIONS_ERROR;
      }
      *filters = filters_00->filters;
      uVar1 = options->block_size;
      if (uVar1 == 0) {
        uVar3 = lzma_mt_block_size(filters_00->filters);
        *block_size = uVar3;
        if (uVar3 == 0) {
          return LZMA_OPTIONS_ERROR;
        }
        if (0x3ffffffffffff < uVar3) {
          __assert_fail("*block_size <= BLOCK_SIZE_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                        ,0x385,
                        "lzma_ret get_options(const lzma_mt *, lzma_options_easy *, const lzma_filter **, uint64_t *, uint64_t *)"
                       );
        }
      }
      else {
        if (uVar1 >> 0x32 != 0) {
          return LZMA_OPTIONS_ERROR;
        }
        *block_size = uVar1;
      }
      uVar3 = lzma_block_buffer_bound64(*block_size);
      *outbuf_size_max = uVar3;
      lVar4 = (uint)(uVar3 == 0) * 5;
    }
  }
  return lVar4;
}

Assistant:

static lzma_ret
get_options(const lzma_mt *options, lzma_options_easy *opt_easy,
		const lzma_filter **filters, uint64_t *block_size,
		uint64_t *outbuf_size_max)
{
	// Validate some of the options.
	if (options == NULL)
		return LZMA_PROG_ERROR;

	if (options->flags != 0 || options->threads == 0
			|| options->threads > LZMA_THREADS_MAX)
		return LZMA_OPTIONS_ERROR;

	if (options->filters != NULL) {
		// Filter chain was given, use it as is.
		*filters = options->filters;
	} else {
		// Use a preset.
		if (lzma_easy_preset(opt_easy, options->preset))
			return LZMA_OPTIONS_ERROR;

		*filters = opt_easy->filters;
	}

	// Block size
	if (options->block_size > 0) {
		if (options->block_size > BLOCK_SIZE_MAX)
			return LZMA_OPTIONS_ERROR;

		*block_size = options->block_size;
	} else {
		// Determine the Block size from the filter chain.
		*block_size = lzma_mt_block_size(*filters);
		if (*block_size == 0)
			return LZMA_OPTIONS_ERROR;

		assert(*block_size <= BLOCK_SIZE_MAX);
	}

	// Calculate the maximum amount output that a single output buffer
	// may need to hold. This is the same as the maximum total size of
	// a Block.
	*outbuf_size_max = lzma_block_buffer_bound64(*block_size);
	if (*outbuf_size_max == 0)
		return LZMA_MEM_ERROR;

	return LZMA_OK;
}